

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CPToken cp_next_(CPState *cp)

{
  byte *pbVar1;
  CPToken CVar2;
  CPState *in_RDI;
  CPToken c;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int local_10c;
  int local_dc;
  int local_ac;
  int local_8c;
  int local_6c;
  int local_4c;
  int local_2c;
  int local_1c;
  
  (in_RDI->sb).p.ptr32 = (in_RDI->sb).b.ptr32;
  do {
    if ((""[(long)in_RDI->c + 1] & 0x80) != 0) {
      if ((""[(long)in_RDI->c + 1] & 8) == 0) {
        CVar2 = cp_ident((CPState *)0x178306);
      }
      else {
        CVar2 = cp_number(in_RDI);
      }
      return CVar2;
    }
    switch(in_RDI->c) {
    case 0:
      return 0x103;
    default:
      CVar2 = in_RDI->c;
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c != 0x5c) {
        return CVar2;
      }
      cp_get_bs((CPState *)CONCAT44(CVar2,in_stack_fffffffffffffeb0));
      return CVar2;
    case 10:
    case 0xd:
      cp_newline(in_RDI);
    case 9:
    case 0xb:
    case 0xc:
    case 0x20:
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      break;
    case 0x21:
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        local_8c = cp_get_bs((CPState *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      else {
        local_8c = in_RDI->c;
      }
      if (local_8c != 0x3d) {
        return 0x21;
      }
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      return 0x107;
    case 0x22:
    case 0x27:
      CVar2 = cp_string((CPState *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      return CVar2;
    case 0x24:
      CVar2 = cp_param((CPState *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      return CVar2;
    case 0x26:
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        local_4c = cp_get_bs((CPState *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      else {
        local_4c = in_RDI->c;
      }
      if (local_4c != 0x26) {
        return 0x26;
      }
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      return 0x105;
    case 0x2d:
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        local_10c = cp_get_bs((CPState *)
                              CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      else {
        local_10c = in_RDI->c;
      }
      if (local_10c != 0x3e) {
        return 0x2d;
      }
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      return 0x10c;
    case 0x2f:
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        local_1c = cp_get_bs((CPState *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      else {
        local_1c = in_RDI->c;
      }
      if (local_1c == 0x2a) {
        cp_comment_c((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      else {
        if (in_RDI->c != 0x2f) {
          return 0x2f;
        }
        cp_comment_cpp((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      break;
    case 0x3c:
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        local_ac = cp_get_bs((CPState *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      else {
        local_ac = in_RDI->c;
      }
      if (local_ac == 0x3d) {
        pbVar1 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar1 + 1);
        in_RDI->c = (uint)*pbVar1;
        if (in_RDI->c == 0x5c) {
          cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        }
        return 0x108;
      }
      if (in_RDI->c == 0x3c) {
        pbVar1 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar1 + 1);
        in_RDI->c = (uint)*pbVar1;
        if (in_RDI->c == 0x5c) {
          cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        }
        return 0x10a;
      }
      return 0x3c;
    case 0x3d:
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        local_6c = cp_get_bs((CPState *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      else {
        local_6c = in_RDI->c;
      }
      if (local_6c != 0x3d) {
        return 0x3d;
      }
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      return 0x106;
    case 0x3e:
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        local_dc = cp_get_bs((CPState *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      else {
        local_dc = in_RDI->c;
      }
      if (local_dc == 0x3d) {
        pbVar1 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar1 + 1);
        in_RDI->c = (uint)*pbVar1;
        if (in_RDI->c == 0x5c) {
          cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        }
        return 0x109;
      }
      if (in_RDI->c == 0x3e) {
        pbVar1 = (byte *)in_RDI->p;
        in_RDI->p = (char *)(pbVar1 + 1);
        in_RDI->c = (uint)*pbVar1;
        if (in_RDI->c == 0x5c) {
          cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        }
        return 0x10b;
      }
      return 0x3e;
    case 0x7c:
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        local_2c = cp_get_bs((CPState *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      else {
        local_2c = in_RDI->c;
      }
      if (local_2c != 0x7c) {
        return 0x7c;
      }
      pbVar1 = (byte *)in_RDI->p;
      in_RDI->p = (char *)(pbVar1 + 1);
      in_RDI->c = (uint)*pbVar1;
      if (in_RDI->c == 0x5c) {
        cp_get_bs((CPState *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      return 0x104;
    }
  } while( true );
}

Assistant:

static CPToken cp_next_(CPState *cp)
{
  lj_buf_reset(&cp->sb);
  for (;;) {
    if (lj_char_isident(cp->c))
      return lj_char_isdigit(cp->c) ? cp_number(cp) : cp_ident(cp);
    switch (cp->c) {
    case '\n': case '\r': cp_newline(cp);  /* fallthrough. */
    case ' ': case '\t': case '\v': case '\f': cp_get(cp); break;
    case '"': case '\'': return cp_string(cp);
    case '/':
      if (cp_get(cp) == '*') cp_comment_c(cp);
      else if (cp->c == '/') cp_comment_cpp(cp);
      else return '/';
      break;
    case '|':
      if (cp_get(cp) != '|') return '|';
      cp_get(cp); return CTOK_OROR;
    case '&':
      if (cp_get(cp) != '&') return '&';
      cp_get(cp); return CTOK_ANDAND;
    case '=':
      if (cp_get(cp) != '=') return '=';
      cp_get(cp); return CTOK_EQ;
    case '!':
      if (cp_get(cp) != '=') return '!';
      cp_get(cp); return CTOK_NE;
    case '<':
      if (cp_get(cp) == '=') { cp_get(cp); return CTOK_LE; }
      else if (cp->c == '<') { cp_get(cp); return CTOK_SHL; }
      return '<';
    case '>':
      if (cp_get(cp) == '=') { cp_get(cp); return CTOK_GE; }
      else if (cp->c == '>') { cp_get(cp); return CTOK_SHR; }
      return '>';
    case '-':
      if (cp_get(cp) != '>') return '-';
      cp_get(cp); return CTOK_DEREF;
    case '$':
      return cp_param(cp);
    case '\0': return CTOK_EOF;
    default: { CPToken c = cp->c; cp_get(cp); return c; }
    }
  }
}